

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O3

MOJOSHADER_effectTechnique *
MOJOSHADER_effectFindNextValidTechnique
          (MOJOSHADER_effect *effect,MOJOSHADER_effectTechnique *technique)

{
  MOJOSHADER_effectTechnique *pMVar1;
  long lVar2;
  MOJOSHADER_effectTechnique *pMVar3;
  
  if (technique == (MOJOSHADER_effectTechnique *)0x0) {
    return effect->techniques;
  }
  lVar2 = (long)effect->technique_count;
  if (0 < lVar2) {
    pMVar3 = effect->techniques;
    do {
      if (pMVar3 == technique) {
        pMVar1 = (MOJOSHADER_effectTechnique *)0x0;
        if ((int)lVar2 != 1) {
          pMVar1 = pMVar3 + 1;
        }
        return pMVar1;
      }
      pMVar3 = pMVar3 + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  __assert_fail("0 && \"Technique is not part of this effect!\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                ,0x6bd,
                "const MOJOSHADER_effectTechnique *MOJOSHADER_effectFindNextValidTechnique(const MOJOSHADER_effect *, const MOJOSHADER_effectTechnique *)"
               );
}

Assistant:

const MOJOSHADER_effectTechnique *MOJOSHADER_effectFindNextValidTechnique(const MOJOSHADER_effect *effect,
                                                                          const MOJOSHADER_effectTechnique *technique
)
{
    int i;
    if (technique == NULL)
        return &effect->techniques[0];
    for (i = 0; i < effect->technique_count; i++)
    {
        if (technique == &effect->techniques[i])
        {
            if (i == effect->technique_count - 1)
                return NULL; /* We were passed the last technique! */
            return &effect->techniques[i + 1];
        } // if
    } // for
    assert(0 && "Technique is not part of this effect!");
}